

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O1

void __thiscall HyperGraph::build_one_RRset(HyperGraph *this,uint32_t uStart,size_t hyperIdx)

{
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar1;
  ulong *puVar2;
  uint uVar3;
  iterator iVar4;
  pointer pvVar5;
  pointer ppVar6;
  _Bit_type *p_Var7;
  pointer puVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  byte bVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  pair<unsigned_int,_float> *nbr;
  pointer ppVar17;
  ulong uVar18;
  double dVar19;
  allocator_type local_61;
  unsigned_long local_60;
  ulong local_58;
  ulong local_50;
  void *local_48 [2];
  long local_38;
  
  pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
           ((this->_FRsets).
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + uStart);
  iVar4._M_current = *(unsigned_long **)(pvVar1 + 8);
  local_60 = hyperIdx;
  if (iVar4._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar4,&local_60);
  }
  else {
    *iVar4._M_current = hyperIdx;
    *(unsigned_long **)(pvVar1 + 8) = iVar4._M_current + 1;
  }
  *(this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uStart;
  uVar16 = 1;
  puVar2 = (this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uStart >> 6);
  *puVar2 = *puVar2 | 1L << ((byte)uStart & 0x3f);
  uVar18 = 0;
  do {
    if (uVar16 <= uVar18) break;
    uVar3 = (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar18];
    if (this->_cascadeModel == LT) {
      pvVar5 = (this->_graph->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar5[uVar3].
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ._M_impl.super__Vector_impl_data + 8) ==
          pvVar5[uVar3].
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_0011e303;
      if (0x17d < dsfmt_global_data.idx) {
        dsfmt_gen_rand_all(&dsfmt_global_data);
        dsfmt_global_data.idx = 0;
      }
      lVar11 = (long)dsfmt_global_data.idx;
      dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
      dVar19 = 2.0 - dsfmt_global_data.status[0].d[lVar11];
      lVar11 = *(long *)&pvVar5[uVar3].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data;
      if ((double)*(float *)(lVar11 + 4) <= dVar19) {
        ppVar17 = *(pointer *)
                   ((long)&pvVar5[uVar3].
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data + 8);
        lVar12 = (long)ppVar17 - lVar11 >> 3;
        if (dVar19 <= (double)ppVar17[-1].second) {
          uVar13 = lVar12 - 1;
          if (uVar13 != 0) {
            uVar15 = 0;
            uVar14 = uVar13;
            do {
              uVar13 = uVar14 + uVar15 >> 1;
              if ((double)*(float *)(lVar11 + 4 + uVar13 * 8) < dVar19) {
                uVar15 = uVar13 + 1;
                uVar13 = uVar14;
              }
              uVar14 = uVar13;
            } while (uVar15 < uVar13);
          }
        }
        else {
          uVar13 = lVar12 + 1;
        }
      }
      else {
        uVar13 = 0;
      }
      pvVar5 = (this->_graph->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = *(long *)&pvVar5[uVar3].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data;
      bVar10 = true;
      if (uVar13 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar5[uVar3].
                                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) - lVar11 >> 3)) {
        uVar3 = *(uint *)(lVar11 + uVar13 * 8);
        p_Var7 = (this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar13 = p_Var7[uVar3 >> 6];
        if ((uVar13 >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar16] = uVar3;
          uVar16 = uVar16 + 1;
          p_Var7[uVar3 >> 6] = 1L << ((byte)uVar3 & 0x3f) | uVar13;
          pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   ((this->_FRsets).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar3);
          iVar4._M_current = *(unsigned_long **)(pvVar1 + 8);
          if (iVar4._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar4,&local_60);
          }
          else {
            *iVar4._M_current = local_60;
            *(unsigned_long **)(pvVar1 + 8) = iVar4._M_current + 1;
          }
          goto LAB_0011e303;
        }
      }
    }
    else {
      if (this->_cascadeModel == IC) {
        pvVar5 = (this->_graph->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar6 = *(pointer *)
                  ((long)&pvVar5[uVar3].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (ppVar17 = pvVar5[uVar3].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; local_50 = uVar18,
            ppVar17 != ppVar6; ppVar17 = ppVar17 + 1) {
          uVar3 = ppVar17->first;
          local_58 = uVar16;
          if (((this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] >>
               ((ulong)uVar3 & 0x3f) & 1) == 0) {
            if (0x17d < dsfmt_global_data.idx) {
              dsfmt_gen_rand_all(&dsfmt_global_data);
              dsfmt_global_data.idx = 0;
            }
            lVar11 = (long)dsfmt_global_data.idx;
            dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
            if (2.0 - dsfmt_global_data.status[0].d[lVar11] <= (double)ppVar17->second) {
              (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_start[local_58] = uVar3;
              puVar2 = (this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (uVar3 >> 6);
              *puVar2 = *puVar2 | 1L << ((byte)uVar3 & 0x3f);
              local_58 = local_58 + 1;
              pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                       ((this->_FRsets).
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar3);
              iVar4._M_current = *(unsigned_long **)(pvVar1 + 8);
              if (iVar4._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar4,&local_60);
              }
              else {
                *iVar4._M_current = local_60;
                *(unsigned_long **)(pvVar1 + 8) = iVar4._M_current + 1;
              }
            }
          }
          uVar16 = local_58;
          uVar18 = local_50;
        }
        bVar10 = false;
        goto LAB_0011e305;
      }
LAB_0011e303:
      bVar10 = false;
    }
LAB_0011e305:
    uVar18 = uVar18 + 1;
  } while (!bVar10);
  if (uVar16 != 0) {
    p_Var7 = (this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    puVar8 = (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar18 = 0;
    do {
      uVar3 = puVar8[uVar18];
      bVar9 = (byte)uVar3 & 0x3f;
      puVar2 = p_Var7 + (uVar3 >> 6);
      *puVar2 = *puVar2 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
      uVar18 = uVar18 + 1;
    } while (uVar16 != uVar18);
  }
  __first._M_current =
       (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_48,__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(__first._M_current + uVar16),&local_61);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->_RRsets,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  return;
}

Assistant:

void build_one_RRset(const uint32_t uStart, const size_t hyperIdx)
    {
        size_t numVisitNode = 0, currIdx = 0;
        _FRsets[uStart].push_back(hyperIdx);
        __vecVisitNode[numVisitNode++] = uStart;
        __vecVisitBool[uStart] = true;
        while (currIdx < numVisitNode)
        {
            const auto expand = __vecVisitNode[currIdx++];
            if (_cascadeModel == IC)
            {
                for (auto& nbr : _graph[expand])
                {
                    const auto nbrId = nbr.first;
                    if (__vecVisitBool[nbrId])
                        continue;
                    const auto randDouble = dsfmt_gv_genrand_open_close();
                    if (randDouble > nbr.second)
                        continue;
                    __vecVisitNode[numVisitNode++] = nbrId;
                    __vecVisitBool[nbrId] = true;
                    _FRsets[nbrId].push_back(hyperIdx);
                }
            }
            else if (_cascadeModel == LT)
            {
                if (_graph[expand].size() == 0)
                    continue;
                const auto nextNbrIdx = gen_random_node_by_weight_LT(_graph[expand]);
                if (nextNbrIdx >= _graph[expand].size()) break; // No element activated
                const auto nbrId = _graph[expand][nextNbrIdx].first;
                if (__vecVisitBool[nbrId]) break; // Stop, no further node activated
                __vecVisitNode[numVisitNode++] = nbrId;
                __vecVisitBool[nbrId] = true;
                _FRsets[nbrId].push_back(hyperIdx);
            }
        }
        for (int i = 0; i < numVisitNode; i++) __vecVisitBool[__vecVisitNode[i]] = false;
        _RRsets.push_back(RRset(__vecVisitNode.begin(), __vecVisitNode.begin() + numVisitNode));
    }